

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

WriteDescriptorResult __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PipelineClient::writeDescriptor
          (PipelineClient *this,Builder descriptor,Vector<int> *fds)

{
  Builder builder;
  QuestionId value;
  QuestionRef *this_00;
  Orphanage orphanage;
  ArrayPtr<const_capnp::PipelineOp> ops;
  WriteDescriptorResult WVar1;
  undefined8 in_stack_ffffffffffffff00;
  Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_> local_68;
  undefined1 local_48 [8];
  Builder promisedAnswer;
  Vector<int> *fds_local;
  PipelineClient *this_local;
  
  rpc::CapDescriptor::Builder::initReceiverAnswer((Builder *)local_48,&descriptor);
  this_00 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
            operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                        *)(fds + 2));
  value = QuestionRef::getId(this_00);
  rpc::PromisedAnswer::Builder::setQuestionId((Builder *)local_48,value);
  builder._builder.dataSize = (int)in_stack_ffffffffffffff00;
  builder._builder.pointerCount = (short)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  builder._builder._38_2_ = (short)((ulong)in_stack_ffffffffffffff00 >> 0x30);
  builder._builder._0_32_ = descriptor._builder._8_32_;
  orphanage = Orphanage::getForMessageContaining<capnp::rpc::CapDescriptor::Builder>(builder);
  ops = kj::Array::operator_cast_to_ArrayPtr((Array *)&fds[2].builder.endPtr);
  anon_unknown_18::fromPipelineOps(&local_68,orphanage,ops);
  rpc::PromisedAnswer::Builder::adoptTransform((Builder *)local_48,&local_68);
  Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_>::~Orphan(&local_68);
  kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this);
  (this->super_RpcClient).super_ClientHook.brand = fds;
  WVar1.described = (ClientHook *)fds;
  WVar1.exportId.ptr = (NullableValue<unsigned_int>)this;
  return WVar1;
}

Assistant:

WriteDescriptorResult writeDescriptor(rpc::CapDescriptor::Builder descriptor,
                                          kj::Vector<int>& fds) override {
      auto promisedAnswer = descriptor.initReceiverAnswer();
      promisedAnswer.setQuestionId(questionRef->getId());
      promisedAnswer.adoptTransform(fromPipelineOps(
          Orphanage::getForMessageContaining(descriptor), ops));
      return {
        .exportId = kj::none,
        .described = *this,
      };
    }